

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

QWidget ** __thiscall
QMap<Qt::GestureType,_QWidget_*>::operator[]
          (QMap<Qt::GestureType,_QWidget_*> *this,GestureType *key)

{
  _Rb_tree_header *p_Var1;
  QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>
  *pQVar2;
  _Rb_tree_iterator<std::pair<const_Qt::GestureType,_QWidget_*>_> _Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  long in_FS_OFFSET;
  bool bVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_Qt::GestureType,_QWidget_*>_>,_bool> pVar7;
  QMap<Qt::GestureType,_QWidget_*> copy;
  pair<const_Qt::GestureType,_QWidget_*> local_30;
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
  local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d).d.ptr;
  if ((pQVar2 == (QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>
                  *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1)) {
    local_20.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_*>
          )(QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>
            *)0x0;
  }
  else {
    local_20.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_*>
          )(this->d).d.ptr;
    if (local_20.d.ptr !=
        (QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>
         *)0x0) {
      LOCK();
      (((QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>
         *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>
                          *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
  }
  detach(this);
  pQVar2 = (this->d).d.ptr;
  p_Var5 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  p_Var1 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = &p_Var1->_M_header;
  if (p_Var5 != (_Base_ptr)0x0) {
    do {
      bVar6 = p_Var5[1]._M_color < *key;
      if (!bVar6) {
        p_Var4 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[bVar6];
    } while (p_Var5 != (_Base_ptr)0x0);
  }
  _Var3._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (_Var3._M_node = p_Var4, *key < p_Var4[1]._M_color))
  {
    _Var3._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)_Var3._M_node == p_Var1) {
    local_30.first = *key;
    local_30.second = (QWidget *)0x0;
    pVar7 = std::
            _Rb_tree<Qt::GestureType,std::pair<Qt::GestureType_const,QWidget*>,std::_Select1st<std::pair<Qt::GestureType_const,QWidget*>>,std::less<Qt::GestureType>,std::allocator<std::pair<Qt::GestureType_const,QWidget*>>>
            ::_M_insert_unique<std::pair<Qt::GestureType_const,QWidget*>>
                      ((_Rb_tree<Qt::GestureType,std::pair<Qt::GestureType_const,QWidget*>,std::_Select1st<std::pair<Qt::GestureType_const,QWidget*>>,std::less<Qt::GestureType>,std::allocator<std::pair<Qt::GestureType_const,QWidget*>>>
                        *)&pQVar2->m,&local_30);
    _Var3 = pVar7.first._M_node;
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return (QWidget **)&_Var3._M_node[1]._M_parent;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }